

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

QByteArray * __thiscall Moc::parsePropertyAccessor(QByteArray *__return_storage_ptr__,Moc *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Token TVar6;
  long in_FS_OFFSET;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  iVar5 = 0;
  do {
    lVar1 = (this->super_Parser).symbols.d.size;
    lVar2 = (this->super_Parser).index;
    TVar6 = NOTOKEN;
    if (lVar2 < lVar1) {
      TVar6 = (this->super_Parser).symbols.d.ptr[lVar2].token;
    }
    if (iVar5 == 0) {
      iVar4 = 0;
      if (TVar6 == PP_RPAREN) {
        bVar3 = false;
      }
      else {
        bVar3 = false;
        if (TVar6 != COMMA) goto LAB_00121500;
      }
    }
    else {
LAB_00121500:
      TVar6 = NOTOKEN;
      if (lVar2 < lVar1) {
        (this->super_Parser).index = lVar2 + 1;
        TVar6 = (this->super_Parser).symbols.d.ptr[lVar2].token;
      }
      QByteArray::mid((longlong)local_50,
                      (longlong)
                      &(this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lex);
      QByteArray::append(__return_storage_ptr__);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],1,0x10);
        }
      }
      bVar3 = true;
      iVar4 = (iVar5 + (uint)(TVar6 == LPAREN)) - (uint)(TVar6 == PP_RPAREN);
    }
    iVar5 = iVar4;
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

QByteArray Moc::parsePropertyAccessor()
{
    int nesting = 0;
    QByteArray accessor;
    while (1) {
        Token t = peek();
        if (!nesting && (t == RPAREN || t == COMMA))
            break;
        t = next();
        if (t == LPAREN)
            ++nesting;
        if (t == RPAREN)
            --nesting;
        accessor += lexem();
    }
    return accessor;
}